

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O2

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::AppendDescriptorChecksumRequest,cfd::js::api::json::OutputDescriptorResponse,cfd::js::api::AppendDescriptorChecksumRequestStruct,cfd::js::api::OutputDescriptorResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
          *elements_function)

{
  string local_290;
  OutputDescriptorResponseStruct response;
  OutputDescriptorResponse res;
  AppendDescriptorChecksumRequestStruct request;
  AppendDescriptorChecksumRequest req;
  
  AppendDescriptorChecksumRequest::AppendDescriptorChecksumRequest(&req);
  core::JsonClassBase<cfd::js::api::json::AppendDescriptorChecksumRequest>::Deserialize
            (&req.super_JsonClassBase<cfd::js::api::json::AppendDescriptorChecksumRequest>,
             (string *)this);
  AppendDescriptorChecksumRequest::ConvertToStruct(&request,&req);
  OutputDescriptorResponseStruct::OutputDescriptorResponseStruct(&response);
  if (request.is_elements == true) {
    std::
    function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
    ::operator()((OutputDescriptorResponseStruct *)&res,bitcoin_function,&request);
  }
  else {
    std::
    function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
    ::operator()((OutputDescriptorResponseStruct *)&res,
                 (function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
                  *)request_message,&request);
  }
  OutputDescriptorResponseStruct::operator=(&response,(OutputDescriptorResponseStruct *)&res);
  OutputDescriptorResponseStruct::~OutputDescriptorResponseStruct
            ((OutputDescriptorResponseStruct *)&res);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (response.error.code == 0) {
    OutputDescriptorResponse::OutputDescriptorResponse(&res);
    OutputDescriptorResponse::ConvertFromStruct(&res,&response);
    core::JsonClassBase<cfd::js::api::json::OutputDescriptorResponse>::Serialize_abi_cxx11_
              (&local_290,&res.super_JsonClassBase<cfd::js::api::json::OutputDescriptorResponse>);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    OutputDescriptorResponse::~OutputDescriptorResponse(&res);
  }
  else {
    ErrorResponse::ConvertFromStruct((ErrorResponse *)&res,&response.error);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_290,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&res);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    ErrorResponseBase::~ErrorResponseBase((ErrorResponseBase *)&res);
  }
  OutputDescriptorResponseStruct::~OutputDescriptorResponseStruct(&response);
  AppendDescriptorChecksumRequestStruct::~AppendDescriptorChecksumRequestStruct(&request);
  AppendDescriptorChecksumRequest::~AppendDescriptorChecksumRequest(&req);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}